

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

void __thiscall hashset<server::userinfo>::clear(hashset<server::userinfo> *this)

{
  int iVar1;
  long lVar2;
  
  if (this->numelems != 0) {
    iVar1 = this->size;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        this->chains[lVar2] = (chain *)0x0;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    this->numelems = 0;
    this->unused = (chain *)0x0;
    deletechunks(this);
    return;
  }
  return;
}

Assistant:

void clear()
    {
        if(!numelems) return;
        loopi(size) chains[i] = NULL;
        numelems = 0;
        unused = NULL;
        deletechunks();
    }